

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hblas3.cxx
# Opt level: O0

void HBLAS3::hblas3_gemm_square_HH_NN_DD_invoker(void)

{
  undefined1 auVar1 [64];
  undefined8 uVar2;
  basic_wrap_stringstream<char> *this;
  basic_wrap_stringstream<char> *s;
  basic_wrap_stringstream<char> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined1 auVar4 [64];
  hblas3_gemm_square_HH_NN_DD t;
  char (*in_stack_fffffffffffff618) [28];
  basic_wrap_stringstream<char> *in_stack_fffffffffffff620;
  std_string *in_stack_fffffffffffff628;
  basic_cstring<const_char> *in_stack_fffffffffffff630;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff640;
  basic_wrap_stringstream<char> *this_01;
  undefined1 local_8c8 [64];
  undefined1 local_888 [64];
  undefined1 local_848 [64];
  undefined1 local_808 [64];
  undefined1 local_7c8 [64];
  undefined1 auStack_788 [24];
  undefined1 local_770 [40];
  undefined1 auStack_748 [24];
  undefined1 local_730 [16];
  basic_cstring<const_char> local_720;
  undefined1 local_709;
  undefined1 local_708 [64];
  undefined1 local_6c8 [64];
  undefined1 local_688 [64];
  undefined1 local_648 [64];
  undefined1 local_608 [64];
  undefined1 auStack_5c8 [24];
  undefined1 local_5b0 [40];
  undefined1 auStack_588 [24];
  undefined1 local_570 [16];
  basic_cstring<const_char> local_560;
  undefined1 local_549;
  undefined1 local_548 [64];
  undefined1 local_508 [64];
  undefined1 local_4c8 [64];
  undefined1 local_488 [64];
  undefined1 local_448 [64];
  undefined1 auStack_408 [24];
  undefined1 local_3f0 [40];
  undefined1 auStack_3c8 [24];
  undefined1 local_3b0 [16];
  basic_cstring<const_char> local_3a0;
  undefined1 local_389;
  undefined1 local_388 [64];
  undefined1 local_348 [64];
  undefined1 local_308 [64];
  undefined1 local_2c8 [64];
  undefined1 local_288 [64];
  undefined1 auStack_248 [24];
  undefined1 local_230 [40];
  undefined1 auStack_208 [24];
  undefined1 local_1e8 [16];
  basic_cstring<const_char> local_1d8;
  undefined1 local_1c5;
  undefined1 local_1b8 [64];
  undefined1 local_178 [64];
  undefined1 local_138 [64];
  undefined1 local_f8 [64];
  undefined1 local_b8 [64];
  undefined1 auStack_78 [24];
  undefined1 local_60 [40];
  undefined1 auStack_38 [24];
  undefined1 local_20 [16];
  basic_cstring<const_char> local_10;
  
  uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_10,
             "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas3.cxx"
             ,0x58);
  auVar4 = ZEXT1664((undefined1  [16])0x0);
  auVar1 = vmovdqu64_avx512f(auVar4);
  auStack_38 = auVar1._40_24_;
  auVar1 = vmovdqu64_avx512f(auVar4);
  auStack_78 = auVar1._0_24_;
  local_60 = auVar1._24_40_;
  local_b8 = vmovdqu64_avx512f(auVar4);
  local_f8 = vmovdqu64_avx512f(auVar4);
  local_138 = vmovdqu64_avx512f(auVar4);
  local_178 = vmovdqu64_avx512f(auVar4);
  local_1b8 = vmovdqu64_avx512f(auVar4);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff620);
  boost::basic_wrap_stringstream<char>::ref((basic_wrap_stringstream<char> *)local_1b8);
  local_1c5 = 0x22;
  boost::operator<<(in_stack_fffffffffffff620,*in_stack_fffffffffffff618);
  boost::operator<<(in_stack_fffffffffffff620,in_stack_fffffffffffff618);
  boost::operator<<(in_stack_fffffffffffff620,(char (*) [15])in_stack_fffffffffffff618);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff640);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffff630,in_stack_fffffffffffff628);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_10,0x97,local_20);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff620);
  uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_1d8,
             "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas3.cxx"
             ,0x58);
  auVar4 = ZEXT1664((undefined1  [16])0x0);
  auVar1 = vmovdqu64_avx512f(auVar4);
  auStack_208 = auVar1._40_24_;
  auVar1 = vmovdqu64_avx512f(auVar4);
  auStack_248 = auVar1._0_24_;
  local_230 = auVar1._24_40_;
  local_288 = vmovdqu64_avx512f(auVar4);
  local_2c8 = vmovdqu64_avx512f(auVar4);
  local_308 = vmovdqu64_avx512f(auVar4);
  local_348 = vmovdqu64_avx512f(auVar4);
  local_388 = vmovdqu64_avx512f(auVar4);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff620);
  boost::basic_wrap_stringstream<char>::ref((basic_wrap_stringstream<char> *)local_388);
  local_389 = 0x22;
  boost::operator<<(in_stack_fffffffffffff620,*in_stack_fffffffffffff618);
  boost::operator<<(in_stack_fffffffffffff620,in_stack_fffffffffffff618);
  boost::operator<<(in_stack_fffffffffffff620,(char (*) [16])in_stack_fffffffffffff618);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff640);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffff630,in_stack_fffffffffffff628);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_1d8,0x97,local_1e8);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff620);
  boost::unit_test::setup_conditional<HBLAS3::hblas3_gemm_square_HH_NN_DD>
            ((hblas3_gemm_square_HH_NN_DD *)in_stack_fffffffffffff620);
  uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_3a0,
             "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas3.cxx"
             ,0x58);
  auVar4 = ZEXT1664((undefined1  [16])0x0);
  auVar1 = vmovdqu64_avx512f(auVar4);
  auStack_3c8 = auVar1._40_24_;
  auVar1 = vmovdqu64_avx512f(auVar4);
  auStack_408 = auVar1._0_24_;
  local_3f0 = auVar1._24_40_;
  local_448 = vmovdqu64_avx512f(auVar4);
  local_488 = vmovdqu64_avx512f(auVar4);
  local_4c8 = vmovdqu64_avx512f(auVar4);
  local_508 = vmovdqu64_avx512f(auVar4);
  local_548 = vmovdqu64_avx512f(auVar4);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff620);
  boost::basic_wrap_stringstream<char>::ref((basic_wrap_stringstream<char> *)local_548);
  local_549 = 0x22;
  boost::operator<<(in_stack_fffffffffffff620,*in_stack_fffffffffffff618);
  boost::operator<<(in_stack_fffffffffffff620,in_stack_fffffffffffff618);
  boost::operator<<(in_stack_fffffffffffff620,(char (*) [13])in_stack_fffffffffffff618);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff640);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffff630,in_stack_fffffffffffff628);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_3a0,0x97,local_3b0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff620);
  hblas3_gemm_square_HH_NN_DD::test_method((hblas3_gemm_square_HH_NN_DD *)0x1fc763);
  uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_560,
             "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas3.cxx"
             ,0x58);
  auVar4 = ZEXT1664((undefined1  [16])0x0);
  auVar1 = vmovdqu64_avx512f(auVar4);
  auStack_588 = auVar1._40_24_;
  auVar1 = vmovdqu64_avx512f(auVar4);
  auStack_5c8 = auVar1._0_24_;
  local_5b0 = auVar1._24_40_;
  local_608 = vmovdqu64_avx512f(auVar4);
  local_648 = vmovdqu64_avx512f(auVar4);
  local_688 = vmovdqu64_avx512f(auVar4);
  local_6c8 = vmovdqu64_avx512f(auVar4);
  local_708 = vmovdqu64_avx512f(auVar4);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff620);
  boost::basic_wrap_stringstream<char>::ref((basic_wrap_stringstream<char> *)local_708);
  local_709 = 0x22;
  boost::operator<<(in_stack_fffffffffffff620,*in_stack_fffffffffffff618);
  boost::operator<<(in_stack_fffffffffffff620,in_stack_fffffffffffff618);
  boost::operator<<(in_stack_fffffffffffff620,(char (*) [19])in_stack_fffffffffffff618);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff640);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffff630,in_stack_fffffffffffff628);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_560,0x97,local_570);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff620);
  boost::unit_test::teardown_conditional<HBLAS3::hblas3_gemm_square_HH_NN_DD>
            ((hblas3_gemm_square_HH_NN_DD *)in_stack_fffffffffffff620);
  uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_720,
             "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas3.cxx"
             ,0x58);
  auVar4 = ZEXT1664((undefined1  [16])0x0);
  auVar1 = vmovdqu64_avx512f(auVar4);
  auStack_748 = auVar1._40_24_;
  auVar1 = vmovdqu64_avx512f(auVar4);
  auStack_788 = auVar1._0_24_;
  local_770 = auVar1._24_40_;
  local_7c8 = vmovdqu64_avx512f(auVar4);
  local_808 = vmovdqu64_avx512f(auVar4);
  local_848 = vmovdqu64_avx512f(auVar4);
  local_888 = vmovdqu64_avx512f(auVar4);
  local_8c8 = vmovdqu64_avx512f(auVar4);
  this_01 = (basic_wrap_stringstream<char> *)local_8c8;
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff620);
  boost::basic_wrap_stringstream<char>::ref(this_01);
  this = boost::operator<<(in_stack_fffffffffffff620,*in_stack_fffffffffffff618);
  s = boost::operator<<(in_stack_fffffffffffff620,in_stack_fffffffffffff618);
  this_00 = boost::operator<<(in_stack_fffffffffffff620,(char (*) [15])in_stack_fffffffffffff618);
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(this_01);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)this,(std_string *)s);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (uVar2,&local_720,0x97,local_730,in_R8,in_R9,pbVar3);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(this_00);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(hblas3_gemm_square_HH_NN_DD) {
  hblas3_gemm<qd,qd,d,d,'N','N'>();
}